

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputAESDecodeStream.cpp
# Opt level: O1

void __thiscall
InputAESDecodeStream::Assign(InputAESDecodeStream *this,IByteReader *inSourceReader,ByteList *inKey)

{
  ulong uVar1;
  uchar *puVar2;
  _List_node_base *p_Var3;
  long lVar4;
  
  this->mSourceStream = inSourceReader;
  uVar1 = (inKey->super__List_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl._M_node.
          _M_size;
  this->mKeyLength = uVar1;
  puVar2 = (uchar *)operator_new__(uVar1);
  this->mKey = puVar2;
  p_Var3 = (inKey->super__List_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl._M_node.
           super__List_node_base._M_next;
  if (p_Var3 != (_List_node_base *)inKey) {
    lVar4 = 0;
    do {
      this->mKey[lVar4] = *(uchar *)&p_Var3[1]._M_next;
      lVar4 = lVar4 + 1;
      p_Var3 = (((_List_base<unsigned_char,_std::allocator<unsigned_char>_> *)&p_Var3->_M_next)->
               _M_impl)._M_node.super__List_node_base._M_next;
    } while (p_Var3 != (_List_node_base *)inKey);
  }
  aes_decrypt_key(this->mKey,(int)this->mKeyLength,(this->mDecrypt).cx);
  this->mReadBlockSize = '\x10';
  this->mIsIvInit = false;
  this->mOutIndex = (uchar *)&this->mOutIndex;
  this->mHitEnd = false;
  return;
}

Assistant:

void InputAESDecodeStream::Assign(IByteReader* inSourceReader, const ByteList& inKey)
{
	mSourceStream = inSourceReader;

	// convert inEncryptionKey to internal rep and init decrypt [let's hope its 16...]
	mKeyLength = inKey.size();
	mKey = new unsigned char[mKeyLength];
	ByteList::const_iterator it = inKey.begin();
	size_t i = 0;
	for (; it != inKey.end(); ++i, ++it)
		mKey[i] = *it;
	mDecrypt.key(mKey, mKeyLength);
	mIsIvInit = false; // first read flag. still need to read IV
	mReadBlockSize = AES_BLOCK_SIZE;
	mOutIndex = mOut + mReadBlockSize;
	mHitEnd = false;
}